

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLMatrix33.cpp
# Opt level: O1

Matrix33 * AML::transpose(Matrix33 *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Matrix33 *in_RDI;
  
  dVar1 = (rhs->field_0).data[1][0];
  dVar2 = (rhs->field_0).data[2][0];
  dVar3 = (rhs->field_0).data[0][1];
  dVar4 = (rhs->field_0).data[1][1];
  dVar5 = (rhs->field_0).data[2][1];
  dVar6 = (rhs->field_0).data[0][2];
  dVar7 = (rhs->field_0).data[1][2];
  dVar8 = (rhs->field_0).data[2][2];
  (in_RDI->field_0).data[0][0] = (rhs->field_0).data[0][0];
  (in_RDI->field_0).data[0][1] = dVar1;
  (in_RDI->field_0).data[0][2] = dVar2;
  (in_RDI->field_0).data[1][0] = dVar3;
  (in_RDI->field_0).data[1][1] = dVar4;
  (in_RDI->field_0).data[1][2] = dVar5;
  (in_RDI->field_0).data[2][0] = dVar6;
  (in_RDI->field_0).data[2][1] = dVar7;
  (in_RDI->field_0).data[2][2] = dVar8;
  return in_RDI;
}

Assistant:

Matrix33 transpose(const Matrix33& rhs)
    {
        double result[9];
        result[0] = rhs.m11;
        result[1] = rhs.m21;
        result[2] = rhs.m31;
        result[3] = rhs.m12;
        result[4] = rhs.m22;
        result[5] = rhs.m32;
        result[6] = rhs.m13;
        result[7] = rhs.m23;
        result[8] = rhs.m33;
        return Matrix33(result);
    }